

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O1

void GraphTask::add_edge_features_group_fn(task_data *D,float fv,uint64_t fx)

{
  float fVar1;
  ulong uVar2;
  example *peVar3;
  ulong uVar4;
  
  uVar2 = D->multiplier;
  if (D->numN != 0) {
    peVar3 = D->cur_node;
    uVar4 = 0;
    do {
      fVar1 = D->neighbor_predictions[uVar4];
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        features::push_back((peVar3->super_example_predict).feature_space + 0x83,fVar1 * fv,
                            (uVar4 * 0x14cc1503 + fx / uVar2) * D->multiplier & D->mask);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < D->numN);
  }
  return;
}

Assistant:

void add_edge_features_group_fn(task_data& D, float fv, uint64_t fx)
{
  example* node = D.cur_node;
  uint64_t fx2 = fx / (uint64_t)D.multiplier;
  for (size_t k = 0; k < D.numN; k++)
  {
    if (D.neighbor_predictions[k] == 0.)
      continue;
    node->feature_space[neighbor_namespace].push_back(
        fv * D.neighbor_predictions[k], (uint64_t)((fx2 + 348919043 * k) * D.multiplier) & (uint64_t)D.mask);
  }
}